

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall wasm::OptimizeInstructions::visitUnary(OptimizeInstructions *this,Unary *curr)

{
  Type *this_00;
  undefined1 uVar1;
  element_type *peVar2;
  element_type *peVar3;
  bool bVar4;
  Id IVar5;
  UnaryOp UVar6;
  BinaryOp BVar7;
  Index IVar8;
  uint uVar9;
  UnaryOp UVar10;
  ulong uVar11;
  undefined1 auVar12 [8];
  Const *right;
  Binary *rep;
  Expression *pEVar13;
  OptimizeInstructions *pOVar14;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_01;
  Literal local_100;
  undefined1 local_e8 [8];
  Binary *inner_1;
  Builder builder;
  anon_union_16_6_1532cd5a_for_Literal_0 local_a0;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_90;
  undefined1 local_80 [8];
  Unary *inner_3;
  anon_union_16_6_1532cd5a_for_Literal_0 local_70;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_60;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_58;
  OptimizeInstructions *local_48;
  element_type *local_40;
  undefined1 local_38 [8];
  Binary *inner;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id == 1) {
    return;
  }
  local_a0.i64 = 0;
  local_80 = (undefined1  [8])0x0;
  inner_1 = (Binary *)local_38;
  builder.wasm._0_4_ = 4;
  local_70.i64 = 0;
  local_70._8_4_ = 0x13;
  local_60 = (anon_union_16_6_1532cd5a_for_Literal_0 *)&inner_1;
  bVar4 = Match::Internal::
          Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
          ::matches((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                     *)&local_70.func,
                    (candidate_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>_>
                     )curr);
  if (bVar4) {
    UVar6 = Abstract::getBinary((Type)*(uintptr_t *)
                                       (*(long *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 0x18) +
                                       8),Eq);
    auVar12 = (undefined1  [8])CONCAT44(local_38._4_4_,local_38._0_4_);
    ((anon_union_16_6_1532cd5a_for_Literal_0 *)
    &(((element_type *)auVar12)->payload).super_SmallVector<wasm::Literal,_1UL>.usedFixed)->i32 =
         UVar6;
    (((SpecificExpression<(wasm::Expression::Id)15> *)&((element_type *)auVar12)->tag)->
    super_Expression).type.id = 2;
    pOVar14 = this;
    goto LAB_00ada854;
  }
  local_80 = (undefined1  [8])0x0;
  inner_1 = (Binary *)local_38;
  local_70._8_4_ = 3;
  local_a0.i64 = 0;
  local_a0._8_4_ = 0x13;
  local_90 = &local_70;
  local_70.i64 = (int64_t)(anon_union_16_6_1532cd5a_for_Literal_0 *)local_e8;
  local_60 = (anon_union_16_6_1532cd5a_for_Literal_0 *)local_80;
  local_58 = (anon_union_16_6_1532cd5a_for_Literal_0 *)&inner_1;
  local_48 = this;
  bVar4 = Match::Internal::
          Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
          ::matches((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
                     *)&local_a0.func,
                    (candidate_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>_>
                     )curr);
  if (bVar4) {
    Literal::neg((Literal *)&inner_1,(Literal *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 0x10));
    Literal::operator=((Literal *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 0x10),
                       (Literal *)&inner_1);
    Literal::~Literal((Literal *)&inner_1);
    BVar7 = Abstract::getBinary((Type)*(uintptr_t *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 8),Eq
                               );
    (((Literals *)((long)local_e8 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].
    field_0.i32 = BVar7;
    (((SpecificExpression<(wasm::Expression::Id)15> *)local_e8)->super_Expression).type.id = 2;
    auVar12 = local_e8;
    pOVar14 = local_48;
    goto LAB_00ada854;
  }
  local_80 = (undefined1  [8])0x0;
  inner_1 = (Binary *)local_38;
  local_70._8_4_ = 9;
  local_a0.i64 = 0;
  local_a0._8_4_ = 0x13;
  local_90 = &local_70;
  local_70._0_8_ = (anon_union_16_6_1532cd5a_for_Literal_0 *)local_e8;
  local_60 = (anon_union_16_6_1532cd5a_for_Literal_0 *)local_80;
  local_58 = (anon_union_16_6_1532cd5a_for_Literal_0 *)&inner_1;
  local_40 = (element_type *)curr;
  bVar4 = Match::Internal::
          Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
          ::matches((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
                     *)&local_a0.func,
                    (candidate_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>_>
                     )curr);
  pOVar14 = local_48;
  if (bVar4) {
    bVar4 = Literal::isSignedMin((Literal *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 0x10));
    pOVar14 = local_48;
    if (bVar4) {
LAB_00ada4ee:
      pOVar14 = local_48;
      BVar7 = Abstract::getBinary((Type)*(uintptr_t *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 8),
                                  And);
      (((Literals *)((long)local_e8 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].
      field_0.i32 = BVar7;
      bVar4 = Literal::isSignedMin((Literal *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 0x10));
      if (bVar4) {
        Literal::makeSignedMax
                  ((Literal *)&inner_1,
                   (Type)*(uintptr_t *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 8));
        Literal::operator=((Literal *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 0x10),
                           (Literal *)&inner_1);
        this_01 = (anon_union_16_6_1532cd5a_for_Literal_0 *)&inner_1;
      }
      else {
        Literal::abs((Literal *)&local_70.func,local_38._0_4_ + 0x10);
        Literal::makeOne((Literal *)&local_a0.func,
                         (Type)*(uintptr_t *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 8));
        Literal::sub((Literal *)&inner_1,(Literal *)&local_70.func,(Literal *)&local_a0.func);
        Literal::operator=((Literal *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 0x10),
                           (Literal *)&inner_1);
        Literal::~Literal((Literal *)&inner_1);
        Literal::~Literal((Literal *)&local_a0.func);
        this_01 = &local_70;
      }
      Literal::~Literal((Literal *)&this_01->func);
      auVar12 = (undefined1  [8])local_40;
      goto LAB_00ada854;
    }
    Literal::abs((Literal *)&local_a0.func,local_38._0_4_ + 0x10);
    uVar11 = Literal::getInteger((Literal *)&local_a0.func);
    if (uVar11 == 0) {
      Literal::~Literal((Literal *)&local_a0.func);
    }
    else {
      Literal::~Literal((Literal *)&local_a0.func);
      pOVar14 = local_48;
      if ((uVar11 & uVar11 - 1) == 0) goto LAB_00ada4ee;
    }
  }
  peVar3 = local_40;
  local_70.i64 = 0;
  inner_1 = (Binary *)0x0;
  builder.wasm._0_4_ = 0x18;
  bVar4 = Match::Internal::
          Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          ::matches((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                     *)&inner_1,
                    (candidate_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>_>
                     )local_40);
  if ((bVar4) &&
     (auVar12 = (undefined1  [8])optimizeWrappedResult(pOVar14,(Unary *)peVar3),
     auVar12 != (undefined1  [8])0x0)) goto LAB_00ada854;
  local_a0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_38;
  inner_1 = (Binary *)0x0;
  local_70._8_4_ = 0x18;
  builder.wasm._0_4_ = 0x14;
  local_70.i64 = (int64_t)(anon_union_16_6_1532cd5a_for_Literal_0 *)local_80;
  local_60 = &local_a0;
  bVar4 = Match::Internal::
          Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
          ::matches((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                     *)&inner_1,
                    (candidate_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>_>
                     )peVar3);
  if ((bVar4) &&
     (IVar8 = Bits::getMaxBits<wasm::OptimizeInstructions>
                        ((Expression *)CONCAT44(local_38._4_4_,local_38._0_4_),pOVar14),
     IVar8 < 0x21)) {
    (((Literals *)((long)local_80 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].
    field_0.i32 = 0x15;
    auVar12 = local_80;
    goto LAB_00ada854;
  }
  if ((((pOVar14->
        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
        ).super_Pass.runner)->options).shrinkLevel == 0) {
    local_70.i64 = 0;
    inner_1 = (Binary *)0x0;
    local_70._8_4_ = 0x13;
    builder.wasm._0_4_ = 0x14;
    local_a0._0_8_ = (anon_union_16_6_1532cd5a_for_Literal_0 *)local_80;
    local_60 = &local_a0;
    bVar4 = Match::Internal::
            Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
            ::matches((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                       *)&inner_1,
                      (candidate_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>_>
                       )local_40);
    if (bVar4) {
      inner_1 = (Binary *)
                (pOVar14->
                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                ).
                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                .
                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                .currModule;
      BVar7 = Abstract::getBinary((Type)(((Literals *)((long)local_80 + 8))->
                                        super_SmallVector<wasm::Literal,_1UL>).usedFixed,Ne);
      auVar12 = local_80;
      Literal::makeZero(&local_100,
                        (Type)(((Literals *)((long)local_80 + 8))->
                              super_SmallVector<wasm::Literal,_1UL>).usedFixed);
      right = Builder::makeConst((Builder *)&inner_1,&local_100);
      rep = Builder::makeBinary((Builder *)&inner_1,BVar7,(Expression *)auVar12,(Expression *)right)
      ;
      replaceCurrent(pOVar14,(Expression *)rep);
      Literal::~Literal(&local_100);
      return;
    }
  }
  local_70.i64 = 0;
  inner_1 = (Binary *)0x0;
  local_70._8_4_ = 0x18;
  local_a0._0_8_ = (anon_union_16_6_1532cd5a_for_Literal_0 *)local_80;
  local_60 = &local_a0;
  bVar4 = Match::Internal::
          Matcher<wasm::Unary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::UnaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
          ::matches((Matcher<wasm::Unary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::UnaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                     *)&inner_1,(candidate_t<wasm::Unary_*>)local_40);
  if (((bVar4) && ((local_38._0_4_ & 0xfffffffe) == 0x16)) &&
     ((IVar8 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)local_80,pOVar14),
      auVar12 = local_80, IVar8 < 0x20 && local_38._0_4_ == 0x16 ||
      (auVar12 = local_80, IVar8 < 0x21 && local_38._0_4_ == 0x17)))) goto LAB_00ada854;
  if (((((pOVar14->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
        .currModule)->features).features & 0x20) == 0) {
LAB_00ada799:
    UVar6 = ((anon_union_16_6_1532cd5a_for_Literal_0 *)
            &(local_40->payload).super_SmallVector<wasm::Literal,_1UL>.usedFixed)->i32;
    auVar12 = (undefined1  [8])
              (local_40->payload).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
              exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (((UVar6 & ~ClzInt64) != ExtendSInt32) ||
       ((((SpecificExpression<(wasm::Expression::Id)15> *)&((element_type *)auVar12)->tag)->
        super_Expression)._id != LoadId)) {
LAB_00ada896:
      IVar8 = getSignExtBits(pOVar14,(Expression *)auVar12);
      UVar6 = ((anon_union_16_6_1532cd5a_for_Literal_0 *)
              &(local_40->payload).super_SmallVector<wasm::Literal,_1UL>.usedFixed)->i32;
      if (IVar8 != 0) {
        if (8 < IVar8 || UVar6 != ExtendS8Int32) {
          if (((8 < IVar8 || UVar6 != ExtendS8Int64) &&
              (0x10 < IVar8 || (UVar6 & ~CtzInt32) != ExtendS16Int32)) &&
             (0x20 < IVar8 || UVar6 != ExtendS32Int64)) goto LAB_00ada8ff;
        }
        auVar12 = (undefined1  [8])
                  (local_40->payload).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                  field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        goto LAB_00ada854;
      }
LAB_00ada8ff:
      if ((UVar6 < ExtendS8Int32) && ((0x600600000000U >> ((ulong)UVar6 & 0x3f) & 1) != 0)) {
        this_00 = &(((SpecificExpression<(wasm::Expression::Id)15> *)&local_40->tag)->
                   super_Expression).type;
        auVar12 = (undefined1  [8])
                  (local_40->payload).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                  field_0.exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        IVar5 = (((SpecificExpression<(wasm::Expression::Id)15> *)&((element_type *)auVar12)->tag)->
                super_Expression)._id;
        if (IVar5 == LoadId) {
          if ((char)(((element_type *)auVar12)->payload).super_SmallVector<wasm::Literal,_1UL>.fixed
                    ._M_elems[0].type.id == '\0') {
            uVar1 = ((anon_union_16_6_1532cd5a_for_Literal_0 *)
                    &(((element_type *)auVar12)->payload).super_SmallVector<wasm::Literal,_1UL>.
                     usedFixed)->v128[0];
            uVar9 = wasm::Type::getByteSize(this_00);
            pOVar14 = local_48;
            if (uVar9 == (byte)uVar1) {
              (((SpecificExpression<(wasm::Expression::Id)15> *)&((element_type *)auVar12)->tag)->
              super_Expression).type.id = this_00->id;
              goto LAB_00ada854;
            }
            UVar6 = ((anon_union_16_6_1532cd5a_for_Literal_0 *)
                    &(local_40->payload).super_SmallVector<wasm::Literal,_1UL>.usedFixed)->i32;
          }
        }
        else if (((IVar5 == UnaryId) &&
                 (uVar11 = (ulong)(uint)((anon_union_16_6_1532cd5a_for_Literal_0 *)
                                        &(((element_type *)auVar12)->payload).
                                         super_SmallVector<wasm::Literal,_1UL>.usedFixed)->i32,
                 uVar11 < 0x2f)) &&
                (((0x600600000000U >> (uVar11 & 0x3f) & 1) != 0 &&
                 (auVar12 = (undefined1  [8])
                            (((element_type *)auVar12)->payload).
                            super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.exnData.
                            super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (((SpecificExpression<(wasm::Expression::Id)15> *)&((element_type *)auVar12)->tag)
                 ->super_Expression).type.id == this_00->id)))) goto LAB_00ada854;
      }
      if (UVar6 - AbsFloat32 < 2) {
        auVar12 = (undefined1  [8])
                  (local_40->payload).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                  field_0.exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        IVar5 = (((SpecificExpression<(wasm::Expression::Id)15> *)&((element_type *)auVar12)->tag)->
                super_Expression)._id;
        if (IVar5 == UnaryId) {
          UVar6 = ((anon_union_16_6_1532cd5a_for_Literal_0 *)
                  &(((element_type *)auVar12)->payload).super_SmallVector<wasm::Literal,_1UL>.
                   usedFixed)->i32;
          UVar10 = Abstract::getUnary((Type)(((SpecificExpression<(wasm::Expression::Id)15> *)
                                             &((element_type *)auVar12)->tag)->super_Expression).
                                            type.id,Neg);
          pOVar14 = local_48;
          if (UVar6 == UVar10) {
            (local_40->payload).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64
                 = (int64_t)(((element_type *)auVar12)->payload).
                            super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
            auVar12 = (undefined1  [8])local_40;
            goto LAB_00ada854;
          }
          auVar12 = (undefined1  [8])
                    (local_40->payload).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                    field_0.exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          IVar5 = (((SpecificExpression<(wasm::Expression::Id)15> *)&((element_type *)auVar12)->tag)
                  ->super_Expression)._id;
        }
        if (IVar5 == BinaryId) {
          UVar6 = ((anon_union_16_6_1532cd5a_for_Literal_0 *)
                  &(((element_type *)auVar12)->payload).super_SmallVector<wasm::Literal,_1UL>.
                   usedFixed)->i32;
          UVar10 = Abstract::getBinary((Type)(((SpecificExpression<(wasm::Expression::Id)15> *)
                                              &((element_type *)auVar12)->tag)->super_Expression).
                                             type.id,Mul);
          if (((UVar6 == UVar10) ||
              (UVar6 = ((anon_union_16_6_1532cd5a_for_Literal_0 *)
                       &(((element_type *)auVar12)->payload).super_SmallVector<wasm::Literal,_1UL>.
                        usedFixed)->i32,
              UVar10 = Abstract::getBinary((Type)(((SpecificExpression<(wasm::Expression::Id)15> *)
                                                  &((element_type *)auVar12)->tag)->super_Expression
                                                 ).type.id,DivS), pOVar14 = local_48,
              UVar6 == UVar10)) &&
             (pOVar14 = local_48,
             bVar4 = areConsecutiveInputsEqual
                               (local_48,(Expression *)
                                         (((element_type *)auVar12)->payload).
                                         super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                                         field_0.gcData.
                                         super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr,
                                (Expression *)
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                ((long)&(((element_type *)auVar12)->payload).
                                        super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                                        field_0.gcData.
                                        super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                + 8))->_M_pi), bVar4)) goto LAB_00ada854;
          if (((pOVar14->fastMath == true) &&
              (UVar6 = ((anon_union_16_6_1532cd5a_for_Literal_0 *)
                       &(((element_type *)auVar12)->payload).super_SmallVector<wasm::Literal,_1UL>.
                        usedFixed)->i32,
              UVar10 = Abstract::getBinary((Type)(((SpecificExpression<(wasm::Expression::Id)15> *)
                                                  &((element_type *)auVar12)->tag)->super_Expression
                                                 ).type.id,Sub), pOVar14 = local_48, UVar6 == UVar10
              )) && ((peVar2 = (((element_type *)auVar12)->payload).
                               super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
                               gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr, *(Id *)&(peVar2->type).id == ConstId &&
                     (bVar4 = Literal::isZero((Literal *)
                                              ((long)&(peVar2->values).
                                                      super_SmallVector<wasm::Literal,_1UL> + 8)),
                     bVar4)))) {
            pEVar13 = *(Expression **)
                       ((long)&(((element_type *)auVar12)->payload).
                               super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
                               super_IString + 8);
            auVar12 = (undefined1  [8])local_40;
            goto LAB_00adaa29;
          }
        }
      }
      else if (UVar6 == EqZInt32) {
        auVar12 = (undefined1  [8])
                  (local_40->payload).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                  field_0.exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        if ((((SpecificExpression<(wasm::Expression::Id)15> *)&((element_type *)auVar12)->tag)->
            super_Expression)._id == BinaryId) {
          UVar6 = invertBinaryOp(pOVar14,((anon_union_16_6_1532cd5a_for_Literal_0 *)
                                         &(((element_type *)auVar12)->payload).
                                          super_SmallVector<wasm::Literal,_1UL>.usedFixed)->i32);
          if (UVar6 != (TruncSatZeroSVecF64x2ToVecI32x4|FloorVecF16x8)) {
            ((anon_union_16_6_1532cd5a_for_Literal_0 *)
            &(((element_type *)auVar12)->payload).super_SmallVector<wasm::Literal,_1UL>.usedFixed)->
            i32 = UVar6;
            goto LAB_00ada854;
          }
          auVar12 = (undefined1  [8])
                    (local_40->payload).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                    field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
        }
        pEVar13 = Properties::getSignExtValue((Expression *)auVar12);
        auVar12 = (undefined1  [8])local_40;
        if (pEVar13 != (Expression *)0x0) {
          IVar8 = Properties::getSignExtBits
                            ((Expression *)
                             (local_40->payload).super_SmallVector<wasm::Literal,_1UL>.fixed.
                             _M_elems[0].field_0.gcData.
                             super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          pEVar13 = makeZeroExt(pOVar14,pEVar13,IVar8);
LAB_00adaa29:
          (((element_type *)auVar12)->payload).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
          [0].field_0.i64 = (int64_t)pEVar13;
          goto LAB_00ada854;
        }
      }
      peVar3 = local_40;
      auVar12 = (undefined1  [8])deduplicateUnary(pOVar14,(Unary *)local_40);
      if (((auVar12 == (undefined1  [8])0x0) &&
          (auVar12 = (undefined1  [8])simplifyRoundingsAndConversions(pOVar14,(Unary *)peVar3),
          auVar12 == (undefined1  [8])0x0)) &&
         (auVar12 = (undefined1  [8])replaceZeroBitsWithZero(pOVar14,(Expression *)peVar3),
         auVar12 == (undefined1  [8])0x0)) {
        return;
      }
      goto LAB_00ada854;
    }
    uVar1 = ((anon_union_16_6_1532cd5a_for_Literal_0 *)
            &(((element_type *)auVar12)->payload).super_SmallVector<wasm::Literal,_1UL>.usedFixed)->
            v128[0];
    if (UVar6 == ExtendSInt32) {
      if (uVar1 == PopcntInt32) {
        if ((char)(((element_type *)auVar12)->payload).super_SmallVector<wasm::Literal,_1UL>.fixed.
                  _M_elems[0].type.id != '\0') goto LAB_00ada896;
        ((anon_union_16_6_1532cd5a_for_Literal_0 *)
        &(((element_type *)auVar12)->payload).super_SmallVector<wasm::Literal,_1UL>.usedFixed)->v128
        [1] = 1;
      }
    }
    else if (((byte)uVar1 < CtzInt64) &&
            (((anon_union_16_6_1532cd5a_for_Literal_0 *)
             &(((element_type *)auVar12)->payload).super_SmallVector<wasm::Literal,_1UL>.usedFixed)
             ->v128[1] != 0)) goto LAB_00ada896;
  }
  else {
    local_a0.i64 = 0;
    inner_1 = (Binary *)0x0;
    local_70._8_4_ = 0x18;
    builder.wasm._0_4_ = 0x16;
    local_70._0_8_ = (anon_union_16_6_1532cd5a_for_Literal_0 *)local_80;
    local_60 = &local_a0;
    bVar4 = Match::Internal::
            Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
            ::matches((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                       *)&inner_1,
                      (candidate_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>_>
                       )local_40);
    if (!bVar4) goto LAB_00ada799;
    (((Literals *)((long)local_80 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].
    field_0.i32 = 0x33;
    auVar12 = local_80;
  }
  (((SpecificExpression<(wasm::Expression::Id)15> *)&((element_type *)auVar12)->tag)->
  super_Expression).type.id = 3;
LAB_00ada854:
  replaceCurrent(pOVar14,(Expression *)auVar12);
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    {
      using namespace Match;
      using namespace Abstract;
      Builder builder(*getModule());
      {
        // eqz(x - y)  =>  x == y
        Binary* inner;
        if (matches(curr, unary(EqZ, binary(&inner, Sub, any(), any())))) {
          inner->op = Abstract::getBinary(inner->left->type, Eq);
          inner->type = Type::i32;
          return replaceCurrent(inner);
        }
      }
      {
        // eqz(x + C)  =>  x == -C
        Const* c;
        Binary* inner;
        if (matches(curr, unary(EqZ, binary(&inner, Add, any(), ival(&c))))) {
          c->value = c->value.neg();
          inner->op = Abstract::getBinary(c->type, Eq);
          inner->type = Type::i32;
          return replaceCurrent(inner);
        }
      }
      {
        // eqz((signed)x % C_pot)  =>  eqz(x & (abs(C_pot) - 1))
        Const* c;
        Binary* inner;
        if (matches(curr, unary(EqZ, binary(&inner, RemS, any(), ival(&c)))) &&
            (c->value.isSignedMin() ||
             Bits::isPowerOf2(c->value.abs().getInteger()))) {
          inner->op = Abstract::getBinary(c->type, And);
          if (c->value.isSignedMin()) {
            c->value = Literal::makeSignedMax(c->type);
          } else {
            c->value = c->value.abs().sub(Literal::makeOne(c->type));
          }
          return replaceCurrent(curr);
        }
      }
      {
        // i32.wrap_i64 can be removed if the operations inside it do not
        // actually require 64 bits, e.g.:
        //
        // i32.wrap_i64(i64.extend_i32_u(x))  =>  x
        if (matches(curr, unary(WrapInt64, any()))) {
          if (auto* ret = optimizeWrappedResult(curr)) {
            return replaceCurrent(ret);
          }
        }
      }
      {
        // i32.eqz(i32.wrap_i64(x))  =>  i64.eqz(x)
        //   where maxBits(x) <= 32
        Unary* inner;
        Expression* x;
        if (matches(curr, unary(EqZInt32, unary(&inner, WrapInt64, any(&x)))) &&
            Bits::getMaxBits(x, this) <= 32) {
          inner->op = EqZInt64;
          return replaceCurrent(inner);
        }
      }
      {
        // i32.eqz(i32.eqz(x))  =>  i32(x) != 0
        // i32.eqz(i64.eqz(x))  =>  i64(x) != 0
        //   iff shinkLevel == 0
        // (1 instruction instead of 2, but 1 more byte)
        if (getPassRunner()->options.shrinkLevel == 0) {
          Expression* x;
          if (matches(curr, unary(EqZInt32, unary(EqZ, any(&x))))) {
            Builder builder(*getModule());
            return replaceCurrent(builder.makeBinary(
              getBinary(x->type, Ne),
              x,
              builder.makeConst(Literal::makeZero(x->type))));
          }
        }
      }
      {
        // i64.extend_i32_s(i32.wrap_i64(x))  =>  x
        //   where maxBits(x) <= 31
        //
        // i64.extend_i32_u(i32.wrap_i64(x))  =>  x
        //   where maxBits(x) <= 32
        Expression* x;
        UnaryOp unaryOp;
        if (matches(curr, unary(&unaryOp, unary(WrapInt64, any(&x))))) {
          if (unaryOp == ExtendSInt32 || unaryOp == ExtendUInt32) {
            auto maxBits = Bits::getMaxBits(x, this);
            if ((unaryOp == ExtendSInt32 && maxBits <= 31) ||
                (unaryOp == ExtendUInt32 && maxBits <= 32)) {
              return replaceCurrent(x);
            }
          }
        }
      }
      if (getModule()->features.hasSignExt()) {
        // i64.extend_i32_s(i32.wrap_i64(x))  =>  i64.extend32_s(x)
        Unary* inner;
        if (matches(curr,
                    unary(ExtendSInt32, unary(&inner, WrapInt64, any())))) {
          inner->op = ExtendS32Int64;
          inner->type = Type::i64;
          return replaceCurrent(inner);
        }
      }
    }

    if (curr->op == ExtendUInt32 || curr->op == ExtendSInt32) {
      if (auto* load = curr->value->dynCast<Load>()) {
        // i64.extend_i32_s(i32.load(_8|_16)(_u|_s)(x))  =>
        //    i64.load(_8|_16|_32)(_u|_s)(x)
        //
        // i64.extend_i32_u(i32.load(_8|_16)(_u|_s)(x))  =>
        //    i64.load(_8|_16|_32)(_u|_s)(x)
        //
        // but we can't do this in following cases:
        //
        //    i64.extend_i32_u(i32.load8_s(x))
        //    i64.extend_i32_u(i32.load16_s(x))
        //
        // this mixed sign/zero extensions can't represent in single
        // signed or unsigned 64-bit load operation. For example if `load8_s(x)`
        // return i8(-1) (0xFF) than sign extended result will be
        // i32(-1) (0xFFFFFFFF) and with zero extension to i64 we got
        // finally 0x00000000FFFFFFFF. However with `i64.load8_s` in this
        // situation we got `i64(-1)` (all ones) and with `i64.load8_u` it
        // will be 0x00000000000000FF.
        //
        // Another limitation is atomics which only have unsigned loads.
        // So we also avoid this only case:
        //
        //   i64.extend_i32_s(i32.atomic.load(x))

        // Special case for i32.load. In this case signedness depends on
        // extend operation.
        bool willBeSigned = curr->op == ExtendSInt32 && load->bytes == 4;
        if (!(curr->op == ExtendUInt32 && load->bytes <= 2 && load->signed_) &&
            !(willBeSigned && load->isAtomic)) {
          if (willBeSigned) {
            load->signed_ = true;
          }
          load->type = Type::i64;
          return replaceCurrent(load);
        }
      }
    }

    // Simple sign extends can be removed if the value is already sign-extended.
    auto signExtBits = getSignExtBits(curr->value);
    if (signExtBits > 0) {
      // Note that we can handle the case of |curr| having a larger sign-extend:
      // if we have an 8-bit value in 32-bit, then there are 24 sign bits, and
      // doing a sign-extend to 16 will only affect 16 of those 24, and the
      // effect is to leave them as they are.
      if ((curr->op == ExtendS8Int32 && signExtBits <= 8) ||
          (curr->op == ExtendS16Int32 && signExtBits <= 16) ||
          (curr->op == ExtendS8Int64 && signExtBits <= 8) ||
          (curr->op == ExtendS16Int64 && signExtBits <= 16) ||
          (curr->op == ExtendS32Int64 && signExtBits <= 32)) {
        return replaceCurrent(curr->value);
      }
    }

    if (Abstract::hasAnyReinterpret(curr->op)) {
      // i32.reinterpret_f32(f32.reinterpret_i32(x))  =>  x
      // i64.reinterpret_f64(f64.reinterpret_i64(x))  =>  x
      // f32.reinterpret_i32(i32.reinterpret_f32(x))  =>  x
      // f64.reinterpret_i64(i64.reinterpret_f64(x))  =>  x
      if (auto* inner = curr->value->dynCast<Unary>()) {
        if (Abstract::hasAnyReinterpret(inner->op)) {
          if (inner->value->type == curr->type) {
            return replaceCurrent(inner->value);
          }
        }
      }
      // f32.reinterpret_i32(i32.load(x))  =>  f32.load(x)
      // f64.reinterpret_i64(i64.load(x))  =>  f64.load(x)
      // i32.reinterpret_f32(f32.load(x))  =>  i32.load(x)
      // i64.reinterpret_f64(f64.load(x))  =>  i64.load(x)
      if (auto* load = curr->value->dynCast<Load>()) {
        if (!load->isAtomic && load->bytes == curr->type.getByteSize()) {
          load->type = curr->type;
          return replaceCurrent(load);
        }
      }
    }

    if (curr->op == EqZInt32) {
      if (auto* inner = curr->value->dynCast<Binary>()) {
        // Try to invert a relational operation using De Morgan's law
        auto op = invertBinaryOp(inner->op);
        if (op != InvalidBinary) {
          inner->op = op;
          return replaceCurrent(inner);
        }
      }
      // eqz of a sign extension can be of zero-extension
      if (auto* ext = Properties::getSignExtValue(curr->value)) {
        // we are comparing a sign extend to a constant, which means we can
        // use a cheaper zext
        auto bits = Properties::getSignExtBits(curr->value);
        curr->value = makeZeroExt(ext, bits);
        return replaceCurrent(curr);
      }
    } else if (curr->op == AbsFloat32 || curr->op == AbsFloat64) {
      // abs(-x)   ==>   abs(x)
      if (auto* unaryInner = curr->value->dynCast<Unary>()) {
        if (unaryInner->op ==
            Abstract::getUnary(unaryInner->type, Abstract::Neg)) {
          curr->value = unaryInner->value;
          return replaceCurrent(curr);
        }
      }
      // abs(x * x)   ==>   x * x
      // abs(x / x)   ==>   x / x
      if (auto* binary = curr->value->dynCast<Binary>()) {
        if ((binary->op == Abstract::getBinary(binary->type, Abstract::Mul) ||
             binary->op == Abstract::getBinary(binary->type, Abstract::DivS)) &&
            areConsecutiveInputsEqual(binary->left, binary->right)) {
          return replaceCurrent(binary);
        }
        // abs(0 - x)   ==>   abs(x),
        // only for fast math
        if (fastMath &&
            binary->op == Abstract::getBinary(binary->type, Abstract::Sub)) {
          if (auto* c = binary->left->dynCast<Const>()) {
            if (c->value.isZero()) {
              curr->value = binary->right;
              return replaceCurrent(curr);
            }
          }
        }
      }
    }

    if (auto* ret = deduplicateUnary(curr)) {
      return replaceCurrent(ret);
    }

    if (auto* ret = simplifyRoundingsAndConversions(curr)) {
      return replaceCurrent(ret);
    }

    if (auto* ret = replaceZeroBitsWithZero(curr)) {
      return replaceCurrent(ret);
    }
  }